

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_read_int_Test::TestBody
          (ByteBufferTest_test_read_int_Test *this)

{
  char *pcVar1;
  AssertHelper local_88;
  AssertionResult gtest_ar_1;
  AssertHelper local_70;
  ByteBuffer byte_buffer2;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [5];
  ByteBuffer byte_buffer1;
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&byte_buffer1,4);
  bidfx_public_api::tools::ByteBuffer::WriteInt((int)&byte_buffer1);
  gtest_ar_1.success_ = true;
  gtest_ar_1._1_3_ = 0x1e2;
  local_88.data_._0_4_ = bidfx_public_api::tools::ByteBuffer::ReadInt();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&byte_buffer2,"123456","byte_buffer1.ReadInt()",(int *)&gtest_ar_1,
             (int *)&local_88);
  if (byte_buffer2 == (ByteBuffer)0x0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (local_60[0].ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       ) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((local_60[0].ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x7e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_88,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_1);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(local_60);
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&byte_buffer2,4);
  bidfx_public_api::tools::ByteBuffer::WriteInt((int)&byte_buffer2);
  local_88.data_._0_4_ = 0xfffe1dc0;
  local_70.data_._0_4_ = bidfx_public_api::tools::ByteBuffer::ReadInt();
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar_1,"-123456","byte_buffer2.ReadInt()",(int *)&local_88,
             (int *)&local_70);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_88);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x82,pcVar1);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_88);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&byte_buffer2);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&byte_buffer1);
  return;
}

Assistant:

TEST(ByteBufferTest, test_read_int)
{
    ByteBuffer byte_buffer1(4);
    byte_buffer1.WriteInt(123456);
    EXPECT_EQ(123456, byte_buffer1.ReadInt());

    ByteBuffer byte_buffer2(4);
    byte_buffer2.WriteInt(-123456);
    EXPECT_EQ(-123456, byte_buffer2.ReadInt());
}